

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

void MOJOSHADER_glGetPixelShaderUniformI(uint idx,int *data,uint ivec4n)

{
  uint uVar1;
  
  if (idx < 0x7ff) {
    uVar1 = 0x7ff - idx;
    if (ivec4n <= 0x7ff - idx) {
      uVar1 = ivec4n;
    }
    memcpy(data,ctx->ps_reg_file_i + (idx << 2),(ulong)(uVar1 << 4));
    return;
  }
  return;
}

Assistant:

void MOJOSHADER_glGetPixelShaderUniformI(unsigned int idx, int *data,
                                         unsigned int ivec4n)
{
    const uint maxregs = STATICARRAYLEN(ctx->ps_reg_file_i) / 4;
    if (idx < maxregs)
    {
        assert(sizeof (GLint) == sizeof (int));
        const uint cpy = (minuint(maxregs - idx, ivec4n) * sizeof (*data)) * 4;
        memcpy(data, ctx->ps_reg_file_i + (idx * 4), cpy);
    } // if
}